

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int katherine_output_block_config_update(katherine_device_t *device)

{
  int iVar1;
  undefined8 in_RAX;
  char ack [8];
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    local_18 = 0x700000000000e;
    iVar1 = katherine_udp_send_exact(&device->control_socket,&local_18,8);
    if (iVar1 == 0) {
      iVar1 = katherine_udp_recv_exact(&device->control_socket,&local_18,8);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_output_block_config_update(katherine_device_t *device)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_hw_output_block_config_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}